

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::Renderable::Create(Renderable *this,uint32_t width,uint32_t height,bool filter,bool clamp)

{
  pointer local_38;
  unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_> local_30;
  unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_> local_28;
  undefined1 local_1a;
  bool local_19;
  uint32_t local_18;
  bool clamp_local;
  uint32_t uStack_14;
  bool filter_local;
  uint32_t height_local;
  uint32_t width_local;
  Renderable *this_local;
  
  local_1a = clamp;
  local_19 = filter;
  local_18 = height;
  uStack_14 = width;
  _height_local = this;
  std::make_unique<olc::Sprite,unsigned_int&,unsigned_int&>
            ((uint *)&local_28,&stack0xffffffffffffffec);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::operator=
            (&this->pSprite,&local_28);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::~unique_ptr(&local_28);
  local_38 = std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::get(&this->pSprite);
  std::make_unique<olc::Decal,olc::Sprite*,bool&,bool&>
            ((Sprite **)&local_30,(bool *)&local_38,&local_19);
  std::unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_>::operator=(&this->pDecal,&local_30);
  std::unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void Renderable::Create(uint32_t width, uint32_t height, bool filter, bool clamp)
	{
		pSprite = std::make_unique<olc::Sprite>(width, height);
		pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter, clamp);
	}